

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3WalCheckpoint
              (Wal *pWal,sqlite3 *db,int eMode,_func_int_void_ptr *xBusy,void *pBusyArg,
              int sync_flags,int nBuf,u8 *zBuf,int *pnLog,int *pnCkpt)

{
  uint *puVar1;
  u16 uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  sqlite3_io_methods *psVar7;
  Wal *pWVar8;
  uint uVar9;
  int iVar10;
  ht_slot *aTmp;
  uint uVar11;
  u32 *puVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  uint *puVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  int *piVar23;
  u32 uVar24;
  sqlite3_uint64 n;
  int local_1d0;
  uint *local_1c8;
  int nMerge;
  ulong local_1b0;
  Wal *local_1a8;
  ulong local_1a0;
  u32 *local_198;
  uint local_18c;
  ulong local_188;
  int isChanged;
  void *local_178;
  int nList;
  undefined4 uStack_16c;
  _func_int_void_ptr *local_168;
  ht_slot *aMerge;
  uint local_154;
  ulong local_150;
  sqlite3 *local_148;
  i64 nSize;
  u32 *local_138;
  uint local_130;
  ulong local_128;
  long local_120;
  uint *local_118;
  long local_110;
  i64 nReq;
  int local_100 [52];
  
  isChanged = 0;
  if (pWal->readOnly != '\0') {
    return 8;
  }
  local_148 = db;
  iVar10 = walLockExclusive(pWal,1,1);
  if (iVar10 != 0) {
    return iVar10;
  }
  pWal->ckptLock = '\x01';
  uVar19 = 0;
  local_178 = pBusyArg;
  if (eMode == 0) {
LAB_00134f38:
    local_1d0 = walIndexReadHdr(pWal,&isChanged);
    if (isChanged != 0) {
      psVar7 = pWal->pDbFd->pMethods;
      if (2 < psVar7->iVersion) {
        (*psVar7->xUnfetch)(pWal->pDbFd,0,(void *)0x0);
      }
    }
  }
  else {
    local_1d0 = walBusyLock(pWal,xBusy,pBusyArg,0,1);
    if (local_1d0 == 5) {
      xBusy = (_func_int_void_ptr *)0x0;
      goto LAB_00134f38;
    }
    if (local_1d0 == 0) {
      pWal->writeLock = '\x01';
      uVar19 = (ulong)(uint)eMode;
      goto LAB_00134f38;
    }
    uVar19 = (ulong)(uint)eMode;
  }
  if (local_1d0 != 0) goto LAB_0013553d;
  uVar14 = (pWal->hdr).mxFrame;
  uVar2 = (pWal->hdr).szPage;
  uVar11 = CONCAT22(uVar2,uVar2) & 0x1fe00;
  if ((uVar14 == 0) || (uVar11 == nBuf)) {
    puVar12 = *pWal->apWiData;
    local_18c = uVar11;
    if (puVar12[0x18] < uVar14) {
      local_150 = (ulong)(pWal->hdr).nPage;
      local_1d0 = 0;
      local_1b0 = uVar19;
      local_198 = puVar12;
      for (lVar22 = 0; lVar22 != 4; lVar22 = lVar22 + 1) {
        uVar11 = puVar12[lVar22 + 0x1a];
        if (uVar11 < uVar14) {
          iVar10 = (int)lVar22 + 4;
          local_1d0 = walBusyLock(pWal,xBusy,local_178,iVar10,1);
          puVar12 = local_198;
          if (local_1d0 == 5) {
            xBusy = (_func_int_void_ptr *)0x0;
            uVar14 = uVar11;
          }
          else {
            if (local_1d0 != 0) {
              local_1c8 = (uint *)0x0;
              uVar19 = local_1b0;
              goto LAB_001354f8;
            }
            local_1d0 = 0;
            local_198[lVar22 + 0x1a] = -(uint)(lVar22 != 0) | uVar14;
            walUnlockExclusive(pWal,iVar10,1);
          }
        }
      }
      if (uVar14 <= puVar12[0x18]) {
        local_1c8 = (uint *)0x0;
        uVar19 = local_1b0;
LAB_00135455:
        iVar10 = 0;
        if (local_1d0 != 5) {
          iVar10 = local_1d0;
        }
        goto LAB_00135461;
      }
      local_1a0 = (ulong)puVar12[0x18];
      uVar11 = (pWal->hdr).mxFrame;
      uVar19 = (ulong)(uVar11 + 0x1000) + 0xffffffff021 >> 0xc;
      lVar22 = uVar19 << 0x20;
      n = (lVar22 >> 0x1b) + (ulong)uVar11 * 2 + 0x28;
      local_1a8 = pWal;
      local_168 = xBusy;
      local_1c8 = (uint *)sqlite3_malloc64(n);
      if (local_1c8 != (uint *)0x0) {
        memset(local_1c8,0,n);
        local_1c8[1] = (int)uVar19 + 1;
        uVar20 = 0x1000;
        if (uVar11 < 0x1000) {
          uVar20 = uVar11;
        }
        local_128 = (ulong)uVar11;
        aTmp = (ht_slot *)sqlite3_malloc64((ulong)(uVar20 * 2));
        local_1d0 = 7;
        if (aTmp != (ht_slot *)0x0) {
          local_1d0 = 0;
        }
        puVar17 = local_1c8 + 2;
        lVar22 = lVar22 >> 0x20;
        local_120 = lVar22;
        local_118 = puVar17;
        for (lVar15 = (long)((ulong)((int)local_1a0 + 0x1001) * 0x100000 + -0xfdf00000) >> 0x20;
            (local_1d0 == 0 && (lVar15 <= lVar22)); lVar15 = lVar15 + 1) {
          local_1d0 = walHashGet(local_1a8,(int)lVar15,(WalHashLoc *)&nSize);
          if (local_1d0 == 0) {
            puVar12 = local_138 + 1;
            if (lVar15 == lVar22) {
              _nList = (ulong)((int)local_128 - local_130);
            }
            else {
              _nList = (ulong)(nSize - (long)puVar12) >> 2;
            }
            local_188 = (long)puVar17 + (ulong)local_130 * 2 + (long)(int)local_1c8[1] * 0x20;
            local_154 = local_130 + 1;
            local_1a0 = 0;
            if (0 < (int)_nList) {
              local_1a0 = _nList & 0xffffffff;
            }
            for (uVar19 = 0; local_1a0 != uVar19; uVar19 = uVar19 + 1) {
              *(short *)(local_188 + uVar19 * 2) = (short)uVar19;
            }
            nMerge = 0;
            aMerge = (ht_slot *)0x0;
            local_138 = puVar12;
            local_130 = local_154;
            local_110 = lVar15;
            memset(&nReq,0,0xd0);
            uVar11 = 0;
            for (uVar19 = 0; uVar19 != local_1a0; uVar19 = uVar19 + 1) {
              nMerge = 1;
              aMerge = (ht_slot *)(local_188 + uVar19 * 2);
              for (uVar11 = 0; uVar13 = (ulong)uVar11, ((uint)uVar19 >> (uVar11 & 0x1f) & 1) != 0;
                  uVar11 = uVar11 + 1) {
                walMerge(puVar12,*(ht_slot **)(local_100 + uVar13 * 4),
                         local_100[(uVar13 * 2 + -1) * 2],&aMerge,&nMerge,aTmp);
              }
              *(ht_slot **)(local_100 + uVar13 * 4) = aMerge;
              local_100[(uVar13 * 2 + -1) * 2] = nMerge;
            }
            uVar13 = (ulong)(uVar11 + 1);
            piVar23 = local_100 + uVar13 * 4;
            uVar19 = _nList;
            while (uVar11 = (uint)uVar13, uVar11 < 0xd) {
              if (((uint)uVar19 >> (uVar11 & 0x1f) & 1) != 0) {
                walMerge(puVar12,*(ht_slot **)piVar23,piVar23[-2],&aMerge,&nMerge,aTmp);
                uVar19 = _nList;
              }
              piVar23 = piVar23 + 4;
              uVar13 = (ulong)(uVar11 + 1);
            }
            local_118[local_110 * 8 + 7] = local_154;
            local_118[local_110 * 8 + 6] = nMerge;
            *(ulong *)(local_118 + local_110 * 8 + 2) = local_188;
            *(u32 **)(local_118 + local_110 * 8 + 4) = puVar12;
            lVar15 = local_110;
            puVar17 = local_118;
            lVar22 = local_120;
          }
        }
        sqlite3_free(aTmp);
        xBusy = local_168;
        pWal = local_1a8;
        uVar19 = local_1b0;
        if (local_1d0 == 0) {
          local_1d0 = walBusyLock(local_1a8,local_168,local_178,3,1);
          puVar12 = local_198;
          if (local_1d0 == 0) {
            uVar24 = local_198[0x18];
            local_198[0x20] = uVar14;
            local_1a0 = (ulong)local_18c;
            uVar11 = (uint)sync_flags >> 2 & 3;
            if ((uVar11 == 0) ||
               (iVar10 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,uVar11), iVar10 == 0)) {
              nReq = local_150 * local_1a0;
              iVar10 = (*pWal->pDbFd->pMethods->xFileSize)(pWal->pDbFd,&nSize);
              if ((iVar10 == 0) && (nSize < nReq)) {
                psVar7 = pWal->pDbFd->pMethods;
                if (psVar7 != (sqlite3_io_methods *)0x0) {
                  iVar10 = 0;
                  (*psVar7->xFileControl)(pWal->pDbFd,5,&nReq);
                }
              }
            }
            local_188 = (ulong)(local_18c | 0x18);
            uVar20 = 0;
            _nList = CONCAT44(uStack_16c,uVar24);
            do {
              do {
                local_1d0 = iVar10;
                uVar9 = local_18c;
                pWVar8 = local_1a8;
                if (local_1d0 != 0) goto LAB_00135807;
                uVar4 = *local_1c8;
                uVar13 = (ulong)local_1c8[1];
                uVar16 = 0xffffffff;
LAB_0013566f:
                if (0 < (int)uVar13) {
                  uVar13 = uVar13 - 1;
                  puVar1 = puVar17 + uVar13 * 8;
                  uVar5 = puVar17[uVar13 * 8 + 6];
                  uVar18 = puVar17[uVar13 * 8];
                  for (lVar22 = (long)(int)uVar18; uVar18 = uVar18 + 1, lVar22 < (int)uVar5;
                      lVar22 = lVar22 + 1) {
                    uVar3 = *(ushort *)(*(long *)(puVar1 + 2) + lVar22 * 2);
                    uVar6 = *(uint *)(*(long *)(puVar1 + 4) + (ulong)uVar3 * 4);
                    if (uVar4 < uVar6) {
                      if (uVar6 < uVar16) {
                        uVar20 = (uint)uVar3 + puVar1[7];
                        uVar16 = uVar6;
                      }
                      break;
                    }
                    *puVar1 = uVar18;
                  }
                  goto LAB_0013566f;
                }
                *local_1c8 = uVar16;
                if (uVar16 == 0xffffffff) {
                  if ((uVar14 != (*local_1a8->apWiData)[4]) ||
                     ((local_1d0 = (*local_1a8->pDbFd->pMethods->xTruncate)
                                             (local_1a8->pDbFd,local_1a0 * (local_1a8->hdr).nPage),
                      uVar19 = local_1b0, local_1d0 == 0 &&
                      ((uVar11 == 0 ||
                       (local_1d0 = (*local_1a8->pDbFd->pMethods->xSync)(local_1a8->pDbFd,uVar11),
                       local_1d0 == 0)))))) {
                    local_198[0x18] = uVar14;
                    local_1d0 = 0;
                  }
                  goto LAB_00135807;
                }
                if ((local_148->u1).isInterrupted != 0) {
                  local_1d0 = (uint)(local_148->mallocFailed == '\0') * 2 + 7;
                  goto LAB_00135807;
                }
                iVar10 = 0;
              } while (((uVar20 <= uVar24) || (uVar14 < uVar20)) || ((uint)local_150 < uVar16));
              local_1d0 = (*local_1a8->pWalFd->pMethods->xRead)
                                    (local_1a8->pWalFd,zBuf,local_18c,
                                     (uVar20 - 1) * local_188 + 0x38);
              uVar19 = local_1b0;
              if (local_1d0 != 0) break;
              local_1d0 = (*pWVar8->pDbFd->pMethods->xWrite)
                                    (pWVar8->pDbFd,zBuf,uVar9,(uVar16 - 1) * local_1a0);
              uVar19 = local_1b0;
              uVar24 = nList;
              iVar10 = 0;
            } while (local_1d0 == 0);
LAB_00135807:
            pWal = local_1a8;
            walUnlockExclusive(local_1a8,3,1);
            puVar12 = local_198;
            xBusy = local_168;
          }
        }
        else {
          sqlite3_free(local_1c8);
          local_1c8 = (uint *)0x0;
          puVar12 = local_198;
          pWal = local_1a8;
          xBusy = local_168;
        }
        goto LAB_00135455;
      }
      local_1c8 = (uint *)0x0;
      pWal = local_1a8;
      uVar19 = local_1b0;
      local_1d0 = 7;
    }
    else {
      local_1c8 = (uint *)0x0;
      iVar10 = 0;
LAB_00135461:
      iVar21 = (int)uVar19;
      local_1d0 = iVar10;
      if (((iVar21 != 0) && (iVar10 == 0)) && (local_1d0 = 5, (pWal->hdr).mxFrame <= puVar12[0x18]))
      {
        if (iVar21 < 2) {
          local_1d0 = 0;
        }
        else {
          sqlite3_randomness(4,&nReq);
          local_1d0 = walBusyLock(pWal,xBusy,local_178,4,4);
          if (local_1d0 == 0) {
            local_1d0 = 0;
            if (iVar21 == 3) {
              walRestartHdr(pWal,(u32)nReq);
              local_1d0 = (*pWal->pWalFd->pMethods->xTruncate)(pWal->pWalFd,0);
            }
            walUnlockExclusive(pWal,4,4);
          }
        }
      }
    }
LAB_001354f8:
    sqlite3_free(local_1c8);
  }
  else {
    local_1d0 = sqlite3CorruptError(0xf1f3);
  }
  if ((local_1d0 == 5) || (local_1d0 == 0)) {
    if (pnLog != (int *)0x0) {
      *pnLog = (pWal->hdr).mxFrame;
    }
    if (pnCkpt != (int *)0x0) {
      *pnCkpt = (*pWal->apWiData)[0x18];
    }
  }
LAB_0013553d:
  if (isChanged != 0) {
    (pWal->hdr).aSalt[0] = 0;
    (pWal->hdr).aSalt[1] = 0;
    (pWal->hdr).aCksum[0] = 0;
    (pWal->hdr).aCksum[1] = 0;
    (pWal->hdr).mxFrame = 0;
    (pWal->hdr).nPage = 0;
    (pWal->hdr).aFrameCksum[0] = 0;
    (pWal->hdr).aFrameCksum[1] = 0;
    (pWal->hdr).iVersion = 0;
    (pWal->hdr).unused = 0;
    (pWal->hdr).iChange = 0;
    (pWal->hdr).isInit = '\0';
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).szPage = 0;
  }
  sqlite3WalEndWriteTransaction(pWal);
  walUnlockExclusive(pWal,1,1);
  iVar10 = 5;
  if (local_1d0 != 0) {
    iVar10 = local_1d0;
  }
  pWal->ckptLock = '\0';
  if ((int)uVar19 == eMode) {
    iVar10 = local_1d0;
  }
  return iVar10;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalCheckpoint(
  Wal *pWal,                      /* Wal connection */
  sqlite3 *db,                    /* Check this handle's interrupt flag */
  int eMode,                      /* PASSIVE, FULL, RESTART, or TRUNCATE */
  int (*xBusy)(void*),            /* Function to call when busy */
  void *pBusyArg,                 /* Context argument for xBusyHandler */
  int sync_flags,                 /* Flags to sync db file with (or 0) */
  int nBuf,                       /* Size of temporary buffer */
  u8 *zBuf,                       /* Temporary buffer to use */
  int *pnLog,                     /* OUT: Number of frames in WAL */
  int *pnCkpt                     /* OUT: Number of backfilled frames in WAL */
){
  int rc;                         /* Return code */
  int isChanged = 0;              /* True if a new wal-index header is loaded */
  int eMode2 = eMode;             /* Mode to pass to walCheckpoint() */
  int (*xBusy2)(void*) = xBusy;   /* Busy handler for eMode2 */

  assert( pWal->ckptLock==0 );
  assert( pWal->writeLock==0 );

  /* EVIDENCE-OF: R-62920-47450 The busy-handler callback is never invoked
  ** in the SQLITE_CHECKPOINT_PASSIVE mode. */
  assert( eMode!=SQLITE_CHECKPOINT_PASSIVE || xBusy==0 );

  if( pWal->readOnly ) return SQLITE_READONLY;
  WALTRACE(("WAL%p: checkpoint begins\n", pWal));

  /* IMPLEMENTATION-OF: R-62028-47212 All calls obtain an exclusive 
  ** "checkpoint" lock on the database file. */
  rc = walLockExclusive(pWal, WAL_CKPT_LOCK, 1);
  if( rc ){
    /* EVIDENCE-OF: R-10421-19736 If any other process is running a
    ** checkpoint operation at the same time, the lock cannot be obtained and
    ** SQLITE_BUSY is returned.
    ** EVIDENCE-OF: R-53820-33897 Even if there is a busy-handler configured,
    ** it will not be invoked in this case.
    */
    testcase( rc==SQLITE_BUSY );
    testcase( xBusy!=0 );
    return rc;
  }
  pWal->ckptLock = 1;

  /* IMPLEMENTATION-OF: R-59782-36818 The SQLITE_CHECKPOINT_FULL, RESTART and
  ** TRUNCATE modes also obtain the exclusive "writer" lock on the database
  ** file.
  **
  ** EVIDENCE-OF: R-60642-04082 If the writer lock cannot be obtained
  ** immediately, and a busy-handler is configured, it is invoked and the
  ** writer lock retried until either the busy-handler returns 0 or the
  ** lock is successfully obtained.
  */
  if( eMode!=SQLITE_CHECKPOINT_PASSIVE ){
    rc = walBusyLock(pWal, xBusy, pBusyArg, WAL_WRITE_LOCK, 1);
    if( rc==SQLITE_OK ){
      pWal->writeLock = 1;
    }else if( rc==SQLITE_BUSY ){
      eMode2 = SQLITE_CHECKPOINT_PASSIVE;
      xBusy2 = 0;
      rc = SQLITE_OK;
    }
  }

  /* Read the wal-index header. */
  if( rc==SQLITE_OK ){
    rc = walIndexReadHdr(pWal, &isChanged);
    if( isChanged && pWal->pDbFd->pMethods->iVersion>=3 ){
      sqlite3OsUnfetch(pWal->pDbFd, 0, 0);
    }
  }

  /* Copy data from the log to the database file. */
  if( rc==SQLITE_OK ){

    if( pWal->hdr.mxFrame && walPagesize(pWal)!=nBuf ){
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = walCheckpoint(pWal, db, eMode2, xBusy2, pBusyArg, sync_flags, zBuf);
    }

    /* If no error occurred, set the output variables. */
    if( rc==SQLITE_OK || rc==SQLITE_BUSY ){
      if( pnLog ) *pnLog = (int)pWal->hdr.mxFrame;
      if( pnCkpt ) *pnCkpt = (int)(walCkptInfo(pWal)->nBackfill);
    }
  }

  if( isChanged ){
    /* If a new wal-index header was loaded before the checkpoint was 
    ** performed, then the pager-cache associated with pWal is now
    ** out of date. So zero the cached wal-index header to ensure that
    ** next time the pager opens a snapshot on this database it knows that
    ** the cache needs to be reset.
    */
    memset(&pWal->hdr, 0, sizeof(WalIndexHdr));
  }

  /* Release the locks. */
  sqlite3WalEndWriteTransaction(pWal);
  walUnlockExclusive(pWal, WAL_CKPT_LOCK, 1);
  pWal->ckptLock = 0;
  WALTRACE(("WAL%p: checkpoint %s\n", pWal, rc ? "failed" : "ok"));
  return (rc==SQLITE_OK && eMode!=eMode2 ? SQLITE_BUSY : rc);
}